

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_script.cpp
# Opt level: O0

ScriptDataResponseStruct *
cfd::js::api::ScriptStructApi::CreateScript
          (ScriptDataResponseStruct *__return_storage_ptr__,CreateScriptRequestStruct *request)

{
  CreateScriptRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateScriptRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateScriptRequestStruct *request_local;
  ScriptDataResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  ScriptDataResponseStruct::ScriptDataResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::ScriptDataResponseStruct(cfd::js::api::CreateScriptRequestStruct_const&)>::
  function<cfd::js::api::ScriptStructApi::CreateScript(cfd::js::api::CreateScriptRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::ScriptDataResponseStruct(cfd::js::api::CreateScriptRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateScript",&local_129);
  ExecuteStructApi<cfd::js::api::CreateScriptRequestStruct,cfd::js::api::ScriptDataResponseStruct>
            ((ScriptDataResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateScriptRequestStruct *)local_108,&local_128,in_R8);
  ScriptDataResponseStruct::operator=
            (__return_storage_ptr__,(ScriptDataResponseStruct *)(local_108 + 0x20));
  ScriptDataResponseStruct::~ScriptDataResponseStruct
            ((ScriptDataResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
  ::~function((function<cfd::js::api::ScriptDataResponseStruct_(const_cfd::js::api::CreateScriptRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

ScriptDataResponseStruct ScriptStructApi::CreateScript(
    const CreateScriptRequestStruct& request) {
  auto call_func = [](const CreateScriptRequestStruct& request)
      -> ScriptDataResponseStruct {
    ScriptDataResponseStruct response;

    if (request.items.size() == 0) {
      warn(CFD_LOG_SOURCE, "empty script items.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to CreateScript. empty script items.");
    }

    ScriptBuilder sb = ScriptBuilder();
    for (const auto& item : request.items) {
      sb.AppendString(item);
    }
    Script script = sb.Build();

    response.hex = script.GetHex();
    return response;
  };

  ScriptDataResponseStruct result;
  result =
      ExecuteStructApi<CreateScriptRequestStruct, ScriptDataResponseStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}